

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  size_type sVar7;
  reference pvVar8;
  mapped_type *pmVar9;
  undefined8 uVar10;
  reference pvVar11;
  value_type pcVar12;
  reference ppcVar13;
  char **extraout_RDX;
  char **token_00;
  char **extraout_RDX_00;
  bool bVar14;
  vertex_index_t vVar15;
  string local_758 [32];
  string local_738 [8];
  string object_name;
  stringstream ss_1;
  ostream local_708 [376];
  ulong local_590;
  size_t j;
  string str;
  string local_560 [39];
  byte local_539;
  string local_538 [7];
  bool ok;
  string err_mtl;
  string warn_mtl;
  size_t s;
  undefined1 local_4e8 [6];
  bool found;
  undefined1 local_4c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  _Self local_4a8;
  int local_49c;
  undefined1 local_498 [4];
  int newMaterialId;
  string namebuf;
  stringstream ss;
  ostream local_468 [376];
  size_t local_2f0;
  size_t n;
  int local_2e0;
  index_t idx;
  int local_2c8;
  int iStack_2c4;
  vertex_index_t vi;
  real_t local_2b4;
  real_t z_2;
  real_t y_2;
  real_t x_2;
  real_t z_1;
  real_t y_1;
  real_t x_1;
  real_t w;
  real_t z;
  real_t y;
  real_t x;
  char *token;
  string linebuf;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  undefined1 local_240 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  undefined1 local_1f0 [4];
  int material_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  string *err_local;
  string *warn_local;
  MaterialReader *readMatFn_local;
  void *user_data_local;
  callback_t *callback_local;
  istream *inStream_local;
  
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)local_1f0);
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::vector
            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
             &materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::vector
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             &names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240,2);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)((long)&linebuf.field_2 + 8));
  std::__cxx11::string::string((string *)&token);
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  do {
                    do {
                      iVar2 = std::istream::peek();
                      if (iVar2 == -1) {
                        if (err != (string *)0x0) {
                          std::__cxx11::stringstream::str();
                          std::__cxx11::string::operator+=((string *)err,local_758);
                          std::__cxx11::string::~string(local_758);
                        }
                        str.field_2._8_4_ = 1;
                        std::__cxx11::string::~string((string *)&token);
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                   ((long)&linebuf.field_2 + 8));
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_240);
                        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                        ~vector((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *
                                )&names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::~vector
                                  ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                                   &materials.
                                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                *)local_1f0);
                        std::__cxx11::stringstream::~stringstream
                                  ((stringstream *)
                                   &material_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
                        return true;
                      }
                      safeGetline(inStream,(string *)&token);
                      lVar3 = std::__cxx11::string::size();
                      if (lVar3 != 0) {
                        std::__cxx11::string::size();
                        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&token);
                        if (*pcVar4 == '\n') {
                          lVar3 = std::__cxx11::string::size();
                          std::__cxx11::string::erase((ulong)&token,lVar3 - 1);
                        }
                      }
                      lVar3 = std::__cxx11::string::size();
                      if (lVar3 != 0) {
                        std::__cxx11::string::size();
                        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&token);
                        if (*pcVar4 == '\r') {
                          lVar3 = std::__cxx11::string::size();
                          std::__cxx11::string::erase((ulong)&token,lVar3 - 1);
                        }
                      }
                      uVar5 = std::__cxx11::string::empty();
                    } while ((uVar5 & 1) != 0);
                    _y = (char *)std::__cxx11::string::c_str();
                    sVar6 = strspn(_y," \t");
                    _y = _y + sVar6;
                    if (_y == (char *)0x0) {
                      __assert_fail("token",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/tiny_obj_loader.h"
                                    ,0xa55,
                                    "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                                   );
                    }
                  } while ((*_y == '\0') || (*_y == '#'));
                  if ((*_y != 'v') || ((_y[1] != ' ' && (_y[1] != '\t')))) break;
                  _y = _y + 2;
                  parseV(&z,&w,&x_1,&y_1,(char **)&y,0.0,0.0,0.0,1.0);
                  if (*(long *)callback != 0) {
                    (**(code **)callback)(z,w,x_1,y_1,user_data);
                  }
                }
                if ((*_y != 'v') || ((_y[1] != 'n' || ((_y[2] != ' ' && (_y[2] != '\t')))))) break;
                _y = _y + 3;
                parseReal3(&z_1,&x_2,&y_2,(char **)&y,0.0,0.0,0.0);
                if (*(long *)(callback + 8) != 0) {
                  (**(code **)(callback + 8))(z_1,x_2,user_data);
                }
              }
              if ((*_y != 'v') || ((_y[1] != 't' || ((_y[2] != ' ' && (_y[2] != '\t')))))) break;
              _y = _y + 3;
              parseReal3(&z_2,&local_2b4,(real_t *)&vi.vn_idx,(char **)&y,0.0,0.0,0.0);
              if (*(long *)(callback + 0x10) != 0) {
                (**(code **)(callback + 0x10))(z_2,local_2b4,user_data);
              }
            }
            if ((*_y != 'f') || ((_y[1] != ' ' && (_y[1] != '\t')))) break;
            _y = _y + 2;
            sVar6 = strspn(_y," \t");
            _y = _y + sVar6;
            std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::clear
                      ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                       &materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            while( true ) {
              bVar14 = true;
              if ((*_y != '\r') && (bVar14 = true, *_y != '\n')) {
                bVar14 = *_y == '\0';
              }
              if (bVar14) break;
              vVar15 = parseRawTriple((char **)&y);
              local_2e0 = vVar15.vn_idx;
              idx._4_8_ = vVar15._0_8_;
              local_2c8 = vVar15.v_idx;
              n._4_4_ = local_2c8;
              iStack_2c4 = vVar15.vt_idx;
              idx.vertex_index = iStack_2c4;
              vi.v_idx = local_2e0;
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         &materials.
                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (value_type *)((long)&n + 4));
              local_2f0 = strspn(_y," \t\r");
              _y = _y + local_2f0;
            }
            if ((*(long *)(callback + 0x18) != 0) &&
               (sVar7 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                                  ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                                   &materials.
                                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage), sVar7 != 0)
               ) {
              pcVar1 = *(code **)(callback + 0x18);
              pvVar8 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::at
                                 ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                                  &materials.
                                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
              sVar7 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                                ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                                 &materials.
                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              (*pcVar1)(user_data,pvVar8,sVar7 & 0xffffffff);
            }
          }
          iVar2 = strncmp(_y,"usemtl",6);
          if ((iVar2 != 0) || ((_y[6] != ' ' && (_y[6] != '\t')))) break;
          _y = _y + 7;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(namebuf.field_2._M_local_buf + 8));
          std::operator<<(local_468,_y);
          std::__cxx11::stringstream::str();
          local_49c = -1;
          local_4a8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)local_1f0,(key_type *)local_498);
          filenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_1f0);
          bVar14 = std::operator!=(&local_4a8,
                                   (_Self *)&filenames.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar14) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_1f0,(key_type *)local_498);
            local_49c = *pmVar9;
          }
          if (local_49c !=
              indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = local_49c;
          }
          if (*(long *)(callback + 0x20) != 0) {
            pcVar1 = *(code **)(callback + 0x20);
            uVar10 = std::__cxx11::string::c_str();
            (*pcVar1)(user_data,uVar10,
                      indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          }
          std::__cxx11::string::~string((string *)local_498);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)(namebuf.field_2._M_local_buf + 8));
        }
        iVar2 = strncmp(_y,"mtllib",6);
        if ((iVar2 == 0) && ((_y[6] == ' ' || (_y[6] == '\t')))) break;
        if ((*_y == 'g') && ((_y[1] == ' ' || (_y[1] == '\t')))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_240);
          token_00 = extraout_RDX;
          while( true ) {
            bVar14 = true;
            if ((*_y != '\r') && (bVar14 = true, *_y != '\n')) {
              bVar14 = *_y == '\0';
            }
            if (bVar14) break;
            parseString_abi_cxx11_((string *)&j,(tinyobj *)&y,token_00);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_240,(value_type *)&j);
            sVar6 = strspn(_y," \t\r");
            _y = _y + sVar6;
            std::__cxx11::string::~string((string *)&j);
            token_00 = extraout_RDX_00;
          }
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_240);
          if (sVar7 == 0) {
            __assert_fail("names.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/tiny_obj_loader.h"
                          ,0xaf0,
                          "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                         );
          }
          if (*(long *)(callback + 0x30) != 0) {
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_240);
            if (sVar7 < 2) {
              (**(code **)(callback + 0x30))(user_data,0);
            }
            else {
              sVar7 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_240);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         ((long)&linebuf.field_2 + 8),sVar7 - 1);
              for (local_590 = 0; uVar5 = local_590,
                  sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                     ((long)&linebuf.field_2 + 8)), uVar5 < sVar7;
                  local_590 = local_590 + 1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_240,local_590 + 1);
                pcVar12 = (value_type)std::__cxx11::string::c_str();
                ppcVar13 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                      ((long)&linebuf.field_2 + 8),local_590);
                *ppcVar13 = pcVar12;
              }
              pcVar1 = *(code **)(callback + 0x30);
              ppcVar13 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at
                                   ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                    ((long)&linebuf.field_2 + 8),0);
              sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                 ((long)&linebuf.field_2 + 8));
              (*pcVar1)(user_data,ppcVar13,sVar7 & 0xffffffff);
            }
          }
        }
        else if ((*_y == 'o') && ((_y[1] == ' ' || (_y[1] == '\t')))) {
          _y = _y + 2;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(object_name.field_2._M_local_buf + 8));
          std::operator<<(local_708,_y);
          std::__cxx11::stringstream::str();
          if (*(long *)(callback + 0x38) != 0) {
            pcVar1 = *(code **)(callback + 0x38);
            uVar10 = std::__cxx11::string::c_str();
            (*pcVar1)(user_data,uVar10);
          }
          str.field_2._8_4_ = 2;
          std::__cxx11::string::~string(local_738);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)(object_name.field_2._M_local_buf + 8));
        }
      }
    } while (readMatFn == (MaterialReader *)0x0);
    _y = _y + 7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4c8);
    pcVar4 = _y;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_4e8,pcVar4,(allocator *)((long)&s + 7));
    SplitString((string *)local_4e8,' ',
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4c8);
    std::__cxx11::string::~string((string *)local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
    bVar14 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4c8);
    if (bVar14) {
      if (warn != (string *)0x0) {
        std::__cxx11::string::operator+=
                  ((string *)warn,"Looks like empty filename for mtllib. Use default material. \n");
      }
    }
    else {
      s._6_1_ = 0;
      for (warn_mtl.field_2._8_8_ = 0;
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_4c8), (ulong)warn_mtl.field_2._8_8_ < sVar7;
          warn_mtl.field_2._8_8_ = warn_mtl.field_2._8_8_ + 1) {
        std::__cxx11::string::string((string *)(err_mtl.field_2._M_local_buf + 8));
        std::__cxx11::string::string(local_538);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4c8,warn_mtl.field_2._8_8_);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_560,pcVar4,(allocator *)(str.field_2._M_local_buf + 0xf))
        ;
        iVar2 = (*readMatFn->_vptr_MaterialReader[2])
                          (readMatFn,local_560,
                           &names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1f0,
                           (undefined1 *)((long)&err_mtl.field_2 + 8),local_538);
        std::__cxx11::string::~string(local_560);
        std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
        local_539 = (byte)iVar2 & 1;
        if ((warn != (string *)0x0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
          std::__cxx11::string::operator+=
                    ((string *)warn,(string *)(err_mtl.field_2._M_local_buf + 8));
        }
        if ((err != (string *)0x0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
          std::__cxx11::string::operator+=((string *)err,local_538);
        }
        if ((local_539 & 1) == 0) {
          str.field_2._8_4_ = 0;
        }
        else {
          s._6_1_ = 1;
          str.field_2._8_4_ = 6;
        }
        std::__cxx11::string::~string(local_538);
        std::__cxx11::string::~string((string *)(err_mtl.field_2._M_local_buf + 8));
        if (str.field_2._8_4_ != 0) break;
      }
      if ((s._6_1_ & 1) == 0) {
        if (warn != (string *)0x0) {
          std::__cxx11::string::operator+=
                    ((string *)warn,"Failed to load material file(s). Use default material.\n");
        }
      }
      else if (*(long *)(callback + 0x28) != 0) {
        pcVar1 = *(code **)(callback + 0x28);
        pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::at
                            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                             &names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        sVar7 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                          ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                           &names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (*pcVar1)(user_data,pvVar11,sVar7 & 0xffffffff);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4c8);
  } while( true );
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { error!! material not found }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}